

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::MatchExpr<const_char_*,_Catch::Matchers::StdString::ContainsMatcher>::MatchExpr
          (MatchExpr<const_char_*,_Catch::Matchers::StdString::ContainsMatcher> *this,char **arg,
          ContainsMatcher *matcher,StringRef *matcherString)

{
  pointer pcVar1;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  allocator local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  std::__cxx11::string::string((string *)local_48,*arg,&local_49);
  iVar4 = (*(matcher->super_StringMatcherBase).
            super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super_MatcherUntypedBase._vptr_MatcherUntypedBase[3])(matcher,local_48);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR___cxa_pure_virtual_00234dc8;
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar4,0);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0022fe28;
  this->m_arg = arg;
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_002342a0;
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->m_matcher).super_StringMatcherBase.
                 super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .super_MatcherUntypedBase.m_cachedToString.field_2;
  pcVar1 = (matcher->super_StringMatcherBase).
           super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->m_matcher).super_StringMatcherBase.
              super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .super_MatcherUntypedBase.m_cachedToString,pcVar1,
             pcVar1 + (matcher->super_StringMatcherBase).
                      super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .super_MatcherUntypedBase.m_cachedToString._M_string_length);
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_002343a0;
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_002343c8;
  (this->m_matcher).super_StringMatcherBase.m_comparator.m_caseSensitivity =
       (matcher->super_StringMatcherBase).m_comparator.m_caseSensitivity;
  (this->m_matcher).super_StringMatcherBase.m_comparator.m_str._M_dataplus._M_p =
       (pointer)&(this->m_matcher).super_StringMatcherBase.m_comparator.m_str.field_2;
  pcVar2 = (matcher->super_StringMatcherBase).m_comparator.m_str._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_matcher).super_StringMatcherBase.m_comparator.m_str,pcVar2,
             pcVar2 + (matcher->super_StringMatcherBase).m_comparator.m_str._M_string_length);
  (this->m_matcher).super_StringMatcherBase.m_operation._M_dataplus._M_p =
       (pointer)&(this->m_matcher).super_StringMatcherBase.m_operation.field_2;
  pcVar1 = (matcher->super_StringMatcherBase).m_operation._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_matcher).super_StringMatcherBase.m_operation,pcVar1,
             pcVar1 + (matcher->super_StringMatcherBase).m_operation._M_string_length);
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_00234428;
  (this->m_matcher).super_StringMatcherBase.
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_00234458;
  sVar3 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar3;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}